

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_out_qemu_ld_direct
               (TCGContext_conflict9 *s,TCGReg datalo,TCGReg datahi,TCGReg base,int index,
               intptr_t ofs,int seg,_Bool is64,MemOp memop)

{
  MemOp MVar1;
  int iVar2;
  int local_3c;
  int movop;
  int rexw;
  MemOp bswap;
  MemOp real_bswap;
  _Bool is64_local;
  intptr_t ofs_local;
  int index_local;
  TCGReg base_local;
  TCGReg datahi_local;
  TCGReg datalo_local;
  TCGContext_conflict9 *s_local;
  
  MVar1 = memop & MO_BE;
  iVar2 = (uint)is64 * 0x1000;
  local_3c = 0x8b;
  movop = MVar1;
  if ((have_movbe) && (MVar1 != MO_8)) {
    movop = 0;
    local_3c = 0x2f0;
  }
  switch(memop & MO_SSIZE) {
  case MO_8:
    tcg_out_modrm_sib_offset(s,seg + 0x1b6,datalo,base,index,0,ofs);
    break;
  case MO_16:
    tcg_out_modrm_sib_offset(s,seg + 0x1b7,datalo,base,index,0,ofs);
    if (MVar1 != MO_8) {
      tcg_out_rolw_8(s,datalo);
    }
    break;
  case MO_32:
    tcg_out_modrm_sib_offset(s,local_3c + seg,datalo,base,index,0,ofs);
    if (movop != 0) {
      tcg_out_bswap32(s,datalo);
    }
    break;
  case MO_64:
    tcg_out_modrm_sib_offset(s,local_3c + 0x1000 + seg,datalo,base,index,0,ofs);
    if (movop != 0) {
      tcg_out_bswap64(s,datalo);
    }
    break;
  case MO_ASHIFT:
    tcg_out_modrm_sib_offset(s,iVar2 + 0x1be + seg,datalo,base,index,0,ofs);
    break;
  case MO_LESW:
    if (MVar1 == MO_8) {
      tcg_out_modrm_sib_offset(s,iVar2 + 0x1bf + seg,datalo,base,index,0,ofs);
    }
    else {
      if (have_movbe) {
        tcg_out_modrm_sib_offset(s,seg + 0x6f0,datalo,base,index,0,ofs);
      }
      else {
        tcg_out_modrm_sib_offset(s,seg + 0x1b7,datalo,base,index,0,ofs);
        tcg_out_rolw_8(s,datalo);
      }
      tcg_out_modrm(s,iVar2 + 0x1bf,datalo,datalo);
    }
    break;
  case MO_LESL:
    if (MVar1 == MO_8) {
      tcg_out_modrm_sib_offset(s,seg + 0x1063,datalo,base,index,0,ofs);
    }
    else {
      tcg_out_modrm_sib_offset(s,local_3c + seg,datalo,base,index,0,ofs);
      if (movop != 0) {
        tcg_out_bswap32(s,datalo);
      }
      tcg_out_ext32s(s,datalo,datalo);
    }
    break;
  default:
    fprintf(_stderr,"%s:%d: tcg fatal error\n",
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
            ,0x817);
    abort();
  }
  return;
}

Assistant:

static void tcg_out_qemu_ld_direct(TCGContext *s, TCGReg datalo, TCGReg datahi,
                                   TCGReg base, int index, intptr_t ofs,
                                   int seg, bool is64, MemOp memop)
{
    const MemOp real_bswap = memop & MO_BSWAP;
    MemOp bswap = real_bswap;
    int rexw = is64 * P_REXW;
    int movop = OPC_MOVL_GvEv;

    if (have_movbe && real_bswap) {
        bswap = 0;
        movop = OPC_MOVBE_GyMy;
    }

    switch (memop & MO_SSIZE) {
    case MO_UB:
        tcg_out_modrm_sib_offset(s, OPC_MOVZBL + seg, datalo,
                                 base, index, 0, ofs);
        break;
    case MO_SB:
        tcg_out_modrm_sib_offset(s, OPC_MOVSBL + rexw + seg, datalo,
                                 base, index, 0, ofs);
        break;
    case MO_UW:
        tcg_out_modrm_sib_offset(s, OPC_MOVZWL + seg, datalo,
                                 base, index, 0, ofs);
        if (real_bswap) {
            tcg_out_rolw_8(s, datalo);
        }
        break;
    case MO_SW:
        if (real_bswap) {
            if (have_movbe) {
                tcg_out_modrm_sib_offset(s, OPC_MOVBE_GyMy + P_DATA16 + seg,
                                         datalo, base, index, 0, ofs);
            } else {
                tcg_out_modrm_sib_offset(s, OPC_MOVZWL + seg, datalo,
                                         base, index, 0, ofs);
                tcg_out_rolw_8(s, datalo);
            }
            tcg_out_modrm(s, OPC_MOVSWL + rexw, datalo, datalo);
        } else {
            tcg_out_modrm_sib_offset(s, OPC_MOVSWL + rexw + seg,
                                     datalo, base, index, 0, ofs);
        }
        break;
    case MO_UL:
        tcg_out_modrm_sib_offset(s, movop + seg, datalo, base, index, 0, ofs);
        if (bswap) {
            tcg_out_bswap32(s, datalo);
        }
        break;
#if TCG_TARGET_REG_BITS == 64
    case MO_SL:
        if (real_bswap) {
            tcg_out_modrm_sib_offset(s, movop + seg, datalo,
                                     base, index, 0, ofs);
            if (bswap) {
                tcg_out_bswap32(s, datalo);
            }
            tcg_out_ext32s(s, datalo, datalo);
        } else {
            tcg_out_modrm_sib_offset(s, OPC_MOVSLQ + seg, datalo,
                                     base, index, 0, ofs);
        }
        break;
#endif
    case MO_Q:
        if (TCG_TARGET_REG_BITS == 64) {
            tcg_out_modrm_sib_offset(s, movop + P_REXW + seg, datalo,
                                     base, index, 0, ofs);
            if (bswap) {
                tcg_out_bswap64(s, datalo);
            }
        } else {
            if (real_bswap) {
                int t = datalo;
                datalo = datahi;
                datahi = t;
            }
            if (base != datalo) {
                tcg_out_modrm_sib_offset(s, movop + seg, datalo,
                                         base, index, 0, ofs);
                tcg_out_modrm_sib_offset(s, movop + seg, datahi,
                                         base, index, 0, ofs + 4);
            } else {
                tcg_out_modrm_sib_offset(s, movop + seg, datahi,
                                         base, index, 0, ofs + 4);
                tcg_out_modrm_sib_offset(s, movop + seg, datalo,
                                         base, index, 0, ofs);
            }
            if (bswap) {
                tcg_out_bswap32(s, datalo);
                tcg_out_bswap32(s, datahi);
            }
        }
        break;
    default:
        tcg_abort();
    }
}